

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_truncated_poisson_dist.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,zero_truncated_poisson_dist *g)

{
  long lVar1;
  double *pdVar2;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  zero_truncated_poisson_dist *in_RSI;
  param_type *in_RDI;
  basic_ostream<char,_std::char_traits<char>_> *unaff_retaddr;
  fmtflags flags;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)((long)&in_RDI->mu_ + *(long *)((long)in_RDI->mu_ + -0x18)));
  lVar1 = *(long *)((long)in_RDI->mu_ + -0x18);
  pdVar2 = &in_RDI->mu_;
  _Var3 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var3 = Catch::clara::std::operator|(_Var3,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)((long)pdVar2 + lVar1),_Var3);
  std::operator<<((ostream *)in_RDI,"[zero-truncated poisson ");
  zero_truncated_poisson_dist::param(in_RSI);
  pbVar4 = operator<<(unaff_retaddr,in_RDI);
  std::operator<<((ostream *)pbVar4,']');
  Catch::clara::std::ios_base::flags
            ((ios_base *)((long)&in_RDI->mu_ + *(long *)((long)in_RDI->mu_ + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(std::basic_ostream<char_t, traits_t> &out,
                                                   const zero_truncated_poisson_dist &g) {
    std::ios_base::fmtflags flags(out.flags());
    out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    out << "[zero-truncated poisson " << g.param() << ']';
    out.flags(flags);
    return out;
  }